

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O3

bool __thiscall helics::TimeData::update(TimeData *this,TimeData *update)

{
  TimeState TVar1;
  TimeState TVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  TVar1 = update->mTimeState;
  TVar2 = this->mTimeState;
  this->mTimeState = TVar1;
  lVar4 = (this->next).internalTimeCode;
  lVar5 = (update->next).internalTimeCode;
  (this->next).internalTimeCode = lVar5;
  lVar6 = (update->Te).internalTimeCode;
  bVar7 = lVar6 != (this->Te).internalTimeCode;
  if (bVar7) {
    (this->Te).internalTimeCode = lVar6;
  }
  lVar6 = (update->minDe).internalTimeCode;
  bVar8 = lVar6 != (this->minDe).internalTimeCode;
  if (bVar8) {
    (this->minDe).internalTimeCode = lVar6;
  }
  lVar6 = (update->TeAlt).internalTimeCode;
  bVar9 = lVar6 != (this->TeAlt).internalTimeCode;
  if (bVar9) {
    (this->TeAlt).internalTimeCode = lVar6;
  }
  iVar3 = (update->minFed).gid;
  bVar10 = iVar3 != (this->minFed).gid;
  if (bVar10) {
    (this->minFed).gid = iVar3;
  }
  if (update->sequenceCounter != this->sequenceCounter) {
    this->sequenceCounter = update->sequenceCounter;
  }
  bVar12 = update->interrupted;
  bVar11 = bVar12 != this->interrupted;
  if (bVar11) {
    this->interrupted = bVar12;
  }
  iVar3 = update->responseSequenceCounter;
  bVar12 = iVar3 != this->responseSequenceCounter;
  if (bVar12) {
    this->responseSequenceCounter = iVar3;
  }
  iVar3 = (update->minFedActual).gid;
  bVar13 = iVar3 != (this->minFedActual).gid;
  if (bVar13) {
    (this->minFedActual).gid = iVar3;
  }
  return bVar13 || (bVar12 ||
                   (bVar11 ||
                   (bVar10 || (lVar4 != lVar5 || (bVar9 || (bVar8 || (bVar7 || TVar2 != TVar1)))))))
  ;
}

Assistant:

bool TimeData::update(const TimeData& update)
{
    bool updated = (mTimeState != update.mTimeState);
    mTimeState = update.mTimeState;

    const Time prev_next = next;
    next = update.next;

    if (update.Te != Te) {
        updated = true;
        Te = update.Te;
    }

    if (update.minDe != minDe) {
        updated = true;
        minDe = update.minDe;
    }
    if (update.TeAlt != TeAlt) {
        updated = true;
        TeAlt = update.TeAlt;
    }

    if (prev_next != next) {
        updated = true;
    }

    if (update.minFed != minFed) {
        minFed = update.minFed;
        updated = true;
    }
    if (update.sequenceCounter != sequenceCounter) {
        sequenceCounter = update.sequenceCounter;
    }

    if (update.interrupted != interrupted) {
        interrupted = update.interrupted;
        updated = true;
    }

    if (update.responseSequenceCounter != responseSequenceCounter) {
        responseSequenceCounter = update.responseSequenceCounter;
        updated = true;
    }
    if (update.minFedActual != minFedActual) {
        minFedActual = update.minFedActual;
        updated = true;
    }

    return updated;
}